

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

bool __thiscall ON_PointGrid::SwapCoordinates(ON_PointGrid *this,int i,int j)

{
  int point_count0;
  int point_count1;
  int iVar1;
  bool bVar2;
  ON_3dPoint *this_00;
  double *p;
  int j_local;
  int i_local;
  ON_PointGrid *this_local;
  
  point_count0 = this->m_point_count[0];
  point_count1 = this->m_point_count[1];
  iVar1 = this->m_point_stride0;
  this_00 = Point(this,0,0);
  p = ON_3dPoint::operator_cast_to_double_(this_00);
  bVar2 = ON_SwapPointGridCoordinates(point_count0,point_count1,iVar1 * 3,3,p,i,j);
  return bVar2;
}

Assistant:

bool ON_PointGrid::SwapCoordinates(
      int i, int j // indices of coords to swap
      )
{
  return ON_SwapPointGridCoordinates( 
            m_point_count[0], m_point_count[1], 
            m_point_stride0*3, 3, 
            Point(0,0), 
            i, j );

}